

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

int Abs_ManExtendOneEval_rec(Vec_Ptr_t *vSimInfo,Aig_Man_t *p,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_38;
  int local_34;
  int Value;
  int Value1;
  int Value0;
  int iFrame_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  Vec_Ptr_t *vSimInfo_local;
  
  vSimInfo_local._4_4_ = Abs_ManSimInfoGet(vSimInfo,pObj,iFrame);
  if (vSimInfo_local._4_4_ == 0) {
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      pAVar2 = Aig_ObjFanin0(pObj);
      Value = Abs_ManExtendOneEval_rec(vSimInfo,p,pAVar2,iFrame);
      iVar1 = Aig_ObjFaninC0(pObj);
      if (iVar1 != 0) {
        Value = Abs_ManSimInfoNot(Value);
      }
      iVar1 = Aig_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc2.c"
                        ,0xaf,
                        "int Abs_ManExtendOneEval_rec(Vec_Ptr_t *, Aig_Man_t *, Aig_Obj_t *, int)");
        }
        if (Value == 1) {
          local_38 = 1;
        }
        else {
          pAVar2 = Aig_ObjFanin1(pObj);
          local_34 = Abs_ManExtendOneEval_rec(vSimInfo,p,pAVar2,iFrame);
          iVar1 = Aig_ObjFaninC1(pObj);
          if (iVar1 != 0) {
            local_34 = Abs_ManSimInfoNot(local_34);
          }
          local_38 = Abs_ManSimInfoAnd(Value,local_34);
        }
        Abs_ManSimInfoSet(vSimInfo,pObj,iFrame,local_38);
        if (local_38 == 0) {
          __assert_fail("Value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc2.c"
                        ,0xba,
                        "int Abs_ManExtendOneEval_rec(Vec_Ptr_t *, Aig_Man_t *, Aig_Obj_t *, int)");
        }
        vSimInfo_local._4_4_ = local_38;
      }
      else {
        Abs_ManSimInfoSet(vSimInfo,pObj,iFrame,Value);
        vSimInfo_local._4_4_ = Value;
      }
    }
    else {
      iVar1 = Saig_ObjIsLo(p,pObj);
      if (iVar1 == 0) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc2.c"
                      ,0xa2,
                      "int Abs_ManExtendOneEval_rec(Vec_Ptr_t *, Aig_Man_t *, Aig_Obj_t *, int)");
      }
      pAVar2 = Saig_ObjLoToLi(p,pObj);
      vSimInfo_local._4_4_ = Abs_ManExtendOneEval_rec(vSimInfo,p,pAVar2,iFrame + -1);
      Abs_ManSimInfoSet(vSimInfo,pObj,iFrame,vSimInfo_local._4_4_);
    }
  }
  return vSimInfo_local._4_4_;
}

Assistant:

int Abs_ManExtendOneEval_rec( Vec_Ptr_t * vSimInfo, Aig_Man_t * p, Aig_Obj_t * pObj, int iFrame )
{
    int Value0, Value1, Value;
    Value = Abs_ManSimInfoGet( vSimInfo, pObj, iFrame );
    if ( Value )
        return Value;
    if ( Aig_ObjIsCi(pObj) )
    {
        assert( Saig_ObjIsLo(p, pObj) );
        Value = Abs_ManExtendOneEval_rec( vSimInfo, p, Saig_ObjLoToLi(p, pObj), iFrame-1 );
        Abs_ManSimInfoSet( vSimInfo, pObj, iFrame, Value );
        return Value;
    }
    Value0 = Abs_ManExtendOneEval_rec( vSimInfo, p, Aig_ObjFanin0(pObj), iFrame );
    if ( Aig_ObjFaninC0(pObj) )
        Value0 = Abs_ManSimInfoNot( Value0 );
    if ( Aig_ObjIsCo(pObj) )
    {
        Abs_ManSimInfoSet( vSimInfo, pObj, iFrame, Value0 );
        return Value0;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( Value0 == ABS_ZER )
        Value = ABS_ZER;
    else
    {
        Value1 = Abs_ManExtendOneEval_rec( vSimInfo, p, Aig_ObjFanin1(pObj), iFrame );
        if ( Aig_ObjFaninC1(pObj) )
            Value1 = Abs_ManSimInfoNot( Value1 );
        Value = Abs_ManSimInfoAnd( Value0, Value1 );
    }
    Abs_ManSimInfoSet( vSimInfo, pObj, iFrame, Value );
    assert( Value );
    return Value;
}